

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void count_integer(void)

{
  undefined4 local_120;
  int local_11c;
  iterator local_118;
  iterator local_100;
  difference_type local_e8 [2];
  undefined4 local_d8;
  int local_d4;
  iterator local_d0;
  iterator local_b8;
  difference_type local_a0 [2];
  undefined4 local_90;
  int local_8c;
  iterator local_88;
  iterator local_60;
  difference_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_38,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_60,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_88,(basic_variable<std::allocator<char>_> *)local_38);
  local_8c = 0;
  local_48[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                          (&local_60,&local_88,&local_8c);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), 0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x25,"void count_integer()",local_48,&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_d0,(basic_variable<std::allocator<char>_> *)local_38);
  local_d4 = 1;
  local_a0[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                          (&local_b8,&local_d0,&local_d4);
  local_d8 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), 1)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x26,"void count_integer()",local_a0,&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_100,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_118,(basic_variable<std::allocator<char>_> *)local_38);
  local_11c = 2;
  local_e8[0] = std::count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                          (&local_100,&local_118,&local_11c);
  local_120 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), 2)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x27,"void count_integer()",local_e8,&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_100);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void count_integer()
{
    variable data(1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), 0), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), 1), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), 2), 0);
}